

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O3

void __thiscall
LinkInfo::fillLinkInfo
          (LinkInfo *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *linkInfo)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__result;
  pointer puVar1;
  pointer puVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  pointer puVar8;
  uint *puVar9;
  int iVar10;
  uchar *__last;
  uchar *puVar11;
  ulong uVar12;
  uchar *__last_00;
  const_iterator cVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  puVar11 = (linkInfo->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11,puVar11 + 4,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)this);
  __result = &this->LinkInfoHeaderSize;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11 + 4,puVar11 + 8,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             __result);
  puVar1 = (this->LinkInfoHeaderSize).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->LinkInfoHeaderSize).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = puVar2 + -1;
  if (puVar1 < puVar8 && puVar1 != puVar2) {
    do {
      puVar7 = puVar1 + 1;
      uVar4 = *puVar1;
      *puVar1 = *puVar8;
      *puVar8 = uVar4;
      puVar8 = puVar8 + -1;
      puVar1 = puVar7;
    } while (puVar7 < puVar8);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11 + 8,puVar11 + 0xc,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->LinkInfoFlags);
  puVar1 = (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar8 = puVar2 + -1;
  if (puVar1 < puVar8 && puVar1 != puVar2) {
    do {
      puVar7 = puVar1 + 1;
      uVar4 = *puVar1;
      *puVar1 = *puVar8;
      *puVar8 = uVar4;
      puVar8 = puVar8 + -1;
      puVar1 = puVar7;
    } while (puVar7 < puVar8);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11 + 0xc,puVar11 + 0x10,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->VolumeIDOffset);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11 + 0x10,puVar11 + 0x14,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->LocalBasePathOffset);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11 + 0x14,puVar11 + 0x18,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CommonNetworkRelativeLinkOffset);
  __last_00 = puVar11 + 0x1c;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (puVar11 + 0x18,__last_00,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CommonPathSuffixOffset);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__result);
  uVar4 = Utils::lenFourBytes(&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0x23 < uVar4) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00,puVar11 + 0x20,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->LocalBasePathOffsetUnicode);
    __last_00 = puVar11 + 0x24;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (puVar11 + 0x20,__last_00,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->CommonPathSuffixOffsetUnicode);
  }
  uVar4 = (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[3];
  if (uVar4 == 1) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00,__last_00 + 4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->VolumeID);
    puVar1 = (this->VolumeID).VolumeIDSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->VolumeID).VolumeIDSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = puVar2 + -1;
    if (puVar1 < puVar8 && puVar1 != puVar2) {
      do {
        puVar7 = puVar1 + 1;
        uVar4 = *puVar1;
        *puVar1 = *puVar8;
        *puVar8 = uVar4;
        puVar8 = puVar8 + -1;
        puVar1 = puVar7;
      } while (puVar7 < puVar8);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_60,&(this->VolumeID).VolumeIDSize);
    uVar4 = Utils::lenFourBytes(&local_60);
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 4,__last_00 + 8,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).DriveType);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 8,__last_00 + 0xc,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).DriveSerialNumber);
    puVar11 = __last_00 + 0x10;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 0xc,puVar11,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).VolumeLabelOffset);
    puVar1 = (this->VolumeID).VolumeLabelOffset.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->VolumeID).VolumeLabelOffset.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = puVar2 + -1;
    puVar7 = puVar1;
    if (puVar1 < puVar8 && puVar1 != puVar2) {
      do {
        puVar9 = puVar7 + 1;
        uVar6 = *puVar7;
        *puVar7 = *puVar8;
        *puVar8 = uVar6;
        puVar8 = puVar8 + -1;
        puVar7 = puVar9;
      } while (puVar9 < puVar8);
    }
    __last = puVar11;
    if (puVar1[3] != 0x10) {
      __last = __last_00 + 0x14;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar11,__last,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->VolumeID).VolumeLabelOffsetUnicode);
      uVar4 = uVar4 - 4;
    }
    cVar13._M_current = __last + (long)(int)uVar4 + -0x10;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last,cVar13._M_current,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->VolumeID).Data);
    iVar5 = Utils::getCountOfBytesBeforeNullTerminator(cVar13);
    __last_00 = __last + (long)iVar5 + (long)(int)uVar4 + -0x11;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (cVar13._M_current,__last_00,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->LocalBasePath);
    uVar4 = (this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3];
  }
  if (uVar4 == 2) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00,__last_00 + 4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->CommonNetworkRelativeLink);
    puVar1 = (this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = puVar2 + -1;
    if (puVar1 < puVar8 && puVar1 != puVar2) {
      do {
        puVar7 = puVar1 + 1;
        uVar4 = *puVar1;
        *puVar1 = *puVar8;
        *puVar8 = uVar4;
        puVar8 = puVar8 + -1;
        puVar1 = puVar7;
      } while (puVar7 < puVar8);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_78,&(this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkSize);
    Utils::lenFourBytes(&local_78);
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 4,__last_00 + 8,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkFlags);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 8,__last_00 + 0xc,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).NetNameOffset);
    puVar1 = (this->CommonNetworkRelativeLink).NetNameOffset.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->CommonNetworkRelativeLink).NetNameOffset.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = puVar2 + -1;
    if (puVar1 < puVar8 && puVar1 != puVar2) {
      do {
        puVar7 = puVar1 + 1;
        uVar4 = *puVar1;
        *puVar1 = *puVar8;
        *puVar8 = uVar4;
        puVar8 = puVar8 + -1;
        puVar1 = puVar7;
      } while (puVar7 < puVar8);
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 0xc,__last_00 + 0x10,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).DeviceNameOffset);
    puVar11 = __last_00 + 0x14;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__last_00 + 0x10,puVar11,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).NetworkProviderType);
    if (0x14 < (this->CommonNetworkRelativeLink).NetNameOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[3]) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar11,__last_00 + 0x18,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).NetNameOffsetUnicode);
      puVar11 = __last_00 + 0x1c;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__last_00 + 0x18,puVar11,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).DeviceNameOffsetUnicode);
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (puVar11,puVar11 + 4,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).NetName);
    __last_00 = puVar11 + 8;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (puVar11 + 4,__last_00,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &(this->CommonNetworkRelativeLink).DeviceName);
    if (0x14 < (this->CommonNetworkRelativeLink).NetNameOffset.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[3]) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__last_00,puVar11 + 0xc,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).NetNameUnicode);
      __last_00 = puVar11 + 0x10;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar11 + 0xc,__last_00,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &(this->CommonNetworkRelativeLink).DeviceNameUnicode);
    }
  }
  puVar1 = (this->LinkInfoSize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->LinkInfoSize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar8 = puVar2 + -1;
  if (puVar1 < puVar8 && puVar1 != puVar2) {
    do {
      puVar7 = puVar1 + 1;
      uVar4 = *puVar1;
      *puVar1 = *puVar8;
      *puVar8 = uVar4;
      puVar8 = puVar8 + -1;
      puVar1 = puVar7;
    } while (puVar7 < puVar8);
  }
  puVar1 = (this->CommonPathSuffixOffset).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->CommonPathSuffixOffset).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = puVar2 + -1;
  if (puVar1 < puVar8 && puVar1 != puVar2) {
    do {
      puVar7 = puVar1 + 1;
      uVar4 = *puVar1;
      *puVar1 = *puVar8;
      *puVar8 = uVar4;
      puVar8 = puVar8 + -1;
      puVar1 = puVar7;
    } while (puVar7 < puVar8);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,&this->LinkInfoSize);
  uVar4 = Utils::lenFourBytes(&local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_d8,&this->CommonPathSuffixOffset);
  uVar6 = Utils::lenFourBytes(&local_d8);
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cVar13._M_current = __last_00 + (int)(uVar4 - uVar6);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__last_00,cVar13._M_current,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CommonPathSuffix);
  if ((this->LinkInfoFlags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[3] == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,__result);
    uVar4 = Utils::lenFourBytes(&local_a8);
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (0x23 < uVar4) {
      uVar3 = *cVar13._M_current;
      uVar12 = 1;
      if (uVar3 != '\\') {
        iVar5 = 0;
        puVar11 = cVar13._M_current;
        do {
          puVar11 = puVar11 + (ulong)(uVar3 == ':') + 1;
          iVar10 = iVar5 + (uint)(uVar3 == ':');
          iVar5 = iVar10 + 1;
          uVar3 = *puVar11;
        } while (uVar3 != '\\');
        uVar12 = (ulong)(iVar10 + 2);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (cVar13._M_current,cVar13._M_current + uVar12,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &this->LocalBasePathUnicode);
      cVar13._M_current = cVar13._M_current + uVar12;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0,__result);
  uVar4 = Utils::lenFourBytes(&local_c0);
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0x23 < uVar4) {
    iVar5 = Utils::getCountOfBytesBeforeNullTerminator(cVar13);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (cVar13._M_current,cVar13._M_current + iVar5,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->CommonPathSuffixUnicode);
  }
  reverseAllFields(this);
  return;
}

Assistant:

void LinkInfo::fillLinkInfo(std::vector<unsigned char> linkInfo) {
    auto it = linkInfo.begin();
   /* mandatory fields */
    copy(it, it + 4, std::back_inserter(LinkInfoSize));                         // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(LinkInfoHeaderSize));                   // 4 byte
    it = it + 4;
    reverse(LinkInfoHeaderSize.begin(), LinkInfoHeaderSize.end());                              // Нужно для дальнейшей проверки

    copy(it, it + 4, std::back_inserter(LinkInfoFlags));                        // 4 byte
    it = it + 4;
    reverse(LinkInfoFlags.begin(), LinkInfoFlags.end());                                        // Нужно для дальнейшей проверки

    copy(it, it + 4, std::back_inserter(VolumeIDOffset));                       // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(LocalBasePathOffset));                  // 4 byte
    it = it + 4;
    copy(it, it+ 4, std::back_inserter(CommonNetworkRelativeLinkOffset));      // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(CommonPathSuffixOffset));               // 4 byte
    it = it + 4;

    /* optional fields */
    /* if the value of the LinkInfoHeaderSize field is greater than or equal to 0x00000024. */
    if (Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        /* if the VolumeIDAndLocalBasePath flag is set, this value is an offset, in bytes,
        from the start of the LinkInfo structure; otherwise, this value MUST be zero */
        copy(it, it + 4, std::back_inserter(LocalBasePathOffsetUnicode));       // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(CommonPathSuffixOffsetUnicode));    // 4 byte
        it = it + 4;
    }

    //  if the VolumeIDAndLocalBasePath flag is set.
    if (LinkInfoFlags[3] == VolumeIDAndLocalBasePath) {
        /* VolumeID structure */
        copy(it, it + 4, std::back_inserter(VolumeID.VolumeIDSize));                    // 4 byte
        it = it + 4;
        reverse(VolumeID.VolumeIDSize.begin(), VolumeID.VolumeIDSize.end());

        int count = Utils::lenFourBytes(VolumeID.VolumeIDSize);
        copy(it, it + 4, std::back_inserter(VolumeID.DriveType));                       // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(VolumeID.DriveSerialNumber));               // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(VolumeID.VolumeLabelOffset));               // 4 byte
        it = it + 4;
        reverse(VolumeID.VolumeLabelOffset.begin(), VolumeID.VolumeLabelOffset.end());     // Нужно для дальнейшей проверки

        /* optional fields */
        if (VolumeID.VolumeLabelOffset[3] != 0x00000010) {   // По документации 14
            copy(it, it + 4, std::back_inserter(VolumeID.VolumeLabelOffsetUnicode));    // 4 byte
            it = it + 4;
            count = count - 4;
        }

        copy(it, it + count - 16, std::back_inserter(VolumeID.Data));                   // 4 byte
        it = it + count - 16;
        /* end of VolumeID structure*/

        /* LocalBasePathOffset specifies the location of the LocalBasePath field */
        //NULL–terminated string
        int countBytesBeforeNullTerminated  = Utils::getCountOfBytesBeforeNullTerminator(it);
        copy(it, it + countBytesBeforeNullTerminated - 1, std::back_inserter(LocalBasePath));
        it = it + countBytesBeforeNullTerminated - 1;
    }

    /* if LinkInfoFlags  = CommonNetworkRelativeLinkAndPathSuffix (gj CommonNetworkRelativeLinkOffset ) */
    if (LinkInfoFlags[3] == CommonNetworkRelativeLinkAndPathSuffix) {
        /* fill CommonNetworkRelativeLink structure */
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize));                    // 4 byte
        it = it + 4;
        reverse(CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize.begin(),
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize.end());
        int count = Utils::lenFourBytes(CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize);
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkFlags));                   // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetNameOffset));                                    // 4 byte
        it = it + 4;
        reverse(CommonNetworkRelativeLink.NetNameOffset.begin(),
                CommonNetworkRelativeLink.NetNameOffset.end());

        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.DeviceNameOffset));                                 // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetworkProviderType));                              // 4 byte
        it = it + 4;
        /* optional fields */
        /* if the value of the NetNameOffset field is greater than 0x00000014 */
        if (CommonNetworkRelativeLink.NetNameOffset[3] > 0x00000014) {
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.NetNameOffsetUnicode));                         // 4 byte
            it = it + 4;
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.DeviceNameOffsetUnicode));                      // 4 byte
            it = it + 4;
        }
        /* end optional fields */
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetName));
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.DeviceName));
        it = it + 4;
        /* optional fields */
        /* NetNameOffset field is greater than 0x00000014 */
        if (CommonNetworkRelativeLink.NetNameOffset[3] > 0x00000014) {
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.NetNameUnicode));
            it = it + 4;
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.DeviceNameUnicode));
            it = it + 4;
        }
        /* end CommonNetworkRelativeLink structure */
    }

    reverse(LinkInfoSize.begin(), LinkInfoSize.end());
    reverse(CommonPathSuffixOffset.begin(), CommonPathSuffixOffset.end());
    int len = Utils::lenFourBytes(LinkInfoSize) - Utils::lenFourBytes(CommonPathSuffixOffset);
    copy(it, it + len, std::back_inserter(CommonPathSuffix));
    it = it + len;

    /* optional fields */
    /* VolumeIDAndLocalBasePath flag is set and the value of the LinkInfoHeaderSize
       field is greater than or equal to 0x00000024. */
    if (LinkInfoFlags[3] == VolumeIDAndLocalBasePath && Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        int countBytesBeforeNullTerminated  = LinkInfo::getCountOfBytesBeforeNullTerminatorForLBP(it);
        copy(it, it + countBytesBeforeNullTerminated, std::back_inserter(LocalBasePathUnicode));
        it = it + countBytesBeforeNullTerminated;
    }

    /* if the value of the LinkInfoHeaderSize field is greater than or equal to 0x00000024. */
    if (Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        int countBytesBeforeNullTerminated  = Utils::getCountOfBytesBeforeNullTerminator(it);
        copy(it, it + countBytesBeforeNullTerminated, std::back_inserter(CommonPathSuffixUnicode));
    }
    LinkInfo::reverseAllFields();
}